

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void * MAPMapPEFile(HANDLE hFile)

{
  CFileProcessLocalData *addr;
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  DWORD DVar5;
  CPalThread *pThread;
  CFileProcessLocalData *pCVar6;
  __off64_t _Var7;
  ssize_t sVar8;
  char *pcVar9;
  size_t sVar10;
  IPalObject *pIVar11;
  IPalObject *pIVar12;
  IMAGE_DOS_HEADER *pIVar13;
  uint uVar14;
  CFileProcessLocalData *pCVar15;
  CFileProcessLocalData *pCVar16;
  CFileProcessLocalData *pCVar17;
  long in_FS_OFFSET;
  int in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  ushort in_stack_fffffffffffffe0e;
  IMAGE_NT_HEADERS ntHeader;
  IMAGE_DOS_HEADER dosHeader;
  void *sectionData;
  undefined8 *local_a0;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IMAGE_DOS_HEADER *loadedHeader;
  CFileProcessLocalData *local_80;
  int local_78;
  int local_74;
  CFileProcessLocalData *local_70;
  char *local_68;
  CFileProcessLocalData *local_60;
  IPalObject *local_58;
  IPalObject *pFileObject;
  int local_48;
  undefined1 local_41 [8];
  char sectionName [9];
  
  sectionName._1_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_58 = (IPalObject *)0x0;
  local_a0 = (undefined8 *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  pLocalData = (CFileProcessLocalData *)0x0;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
  DVar5 = 6;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
LAB_00130038:
    pCVar6 = (CFileProcessLocalData *)0x0;
  }
  else {
    iVar3 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                      (CorUnix::g_pObjectManager,pThread,hFile,CorUnix::aotFile,0x80000000);
    if ((iVar3 != 0) ||
       (iVar3 = (*local_58->_vptr_IPalObject[3])(local_58,pThread,0,&local_a0,&pLocalDataLock),
       iVar3 != 0)) {
joined_r0x001301ef:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
      goto LAB_00130038;
    }
    iVar3 = *(int *)&pLocalDataLock[1]._vptr_IDataLock;
    pCVar6 = (CFileProcessLocalData *)__errno_location();
    *(int *)&pCVar6->pLockController = 0;
    _Var7 = lseek64(iVar3,0,0);
    if ((_Var7 != 0) ||
       (sVar8 = read(iVar3,ntHeader.OptionalHeader.DataDirectory + 0xf,0x40), sVar8 != 0x40)) {
      DVar5 = FILEGetLastErrorFromErrno();
      goto joined_r0x001301ef;
    }
    local_70 = pCVar6;
    _Var7 = lseek64(iVar3,(long)(int)dosHeader.e_res2._12_4_,0);
    if ((_Var7 == (int)dosHeader.e_res2._12_4_) &&
       (sVar8 = read(iVar3,&stack0xfffffffffffffe08,0x108), sVar8 == 0x108)) {
      if (((short)ntHeader.OptionalHeader.DataDirectory[0xf].VirtualAddress == 0x5a4d) &&
         (((in_stack_fffffffffffffe08 == 0x4550 &&
           ((short)ntHeader.FileHeader.NumberOfSymbols == 0x20b)) &&
          (0xfff < ntHeader.OptionalHeader.ImageBase._4_4_)))) {
        pCVar6 = (CFileProcessLocalData *)(ulong)(uint)ntHeader.OptionalHeader._48_4_;
        pFileObject = (IPalObject *)ntHeader.OptionalHeader._16_8_;
        if (((ntHeader.OptionalHeader._16_8_ != 0) && (ntHeader.OptionalHeader._48_4_ != 0)) &&
           (!CARRY8(ntHeader.OptionalHeader._16_8_,(ulong)pCVar6))) {
          pcVar9 = getenv("PAL_ForceRelocs");
          if ((pcVar9 == (char *)0x0) || (sVar10 = strlen(pcVar9), sVar10 == 0)) {
            iVar4 = 0;
          }
          else {
            iVar4 = (int)CONCAT71((int7)(sVar10 >> 8),1);
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
          }
          pIVar12 = pFileObject;
          local_78 = iVar3;
          local_48 = iVar4;
          if ((char)iVar4 == '\0') {
            pIVar11 = (IPalObject *)0x0;
          }
          else {
            pIVar11 = (IPalObject *)mmap64(pFileObject,0x1000,0,0x30,-1,0);
            if (pIVar11 == (IPalObject *)&DAT_ffffffffffffffff) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
              pIVar11 = (IPalObject *)&DAT_ffffffffffffffff;
              local_48 = 0;
            }
            else if ((pIVar11 != pIVar12) && (PAL_InitializeChakraCoreCalled == false))
            goto LAB_001306a0;
          }
          CorUnix::InternalEnterCriticalSection(pThread,&mapping_critsec);
          pIVar12 = pFileObject;
          local_60 = pCVar6;
          pCVar6 = (CFileProcessLocalData *)mmap64(pFileObject,(size_t)pCVar6,0,0x22,-1,0);
          if (pCVar6 == (CFileProcessLocalData *)&DAT_ffffffffffffffff) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
            strerror(*(int *)&local_70->pLockController);
            pCVar6 = (CFileProcessLocalData *)0x0;
            DVar5 = FILEGetLastErrorFromErrno();
            goto LAB_00130435;
          }
          if ((char)local_48 != '\0') {
            if ((CFileProcessLocalData *)pIVar12 == pCVar6) {
              fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x980);
              fprintf(_stderr,"Expression: ((SIZE_T)loadedBase) != preferredBase\n");
            }
            munmap(pIVar11,0x1000);
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
          DVar5 = MAPmmapAndRecord(local_58,pCVar6,pCVar6,0x1000,1,local_78,0,(off_t)&pLocalData,
                                   (LPVOID *)
                                   CONCAT26(in_stack_fffffffffffffe0e,
                                            CONCAT24(in_stack_fffffffffffffe0c,
                                                     in_stack_fffffffffffffe08)));
          pCVar17 = pLocalData;
          if (DVar5 == 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
            if (pLocalData != pCVar6) {
              fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                      ,0x99e);
              fprintf(_stderr,"Expression: loadedHeader == loadedBase\n");
            }
            lVar2 = (ulong)(ushort)ntHeader.FileHeader.PointerToSymbolTable +
                    (long)*(int *)(pCVar17->unix_filename + 0x24);
            pCVar15 = (CFileProcessLocalData *)(pCVar17->unix_filename + lVar2);
            if (pCVar15 < pCVar6) {
LAB_00130425:
              DVar5 = 0x57;
              goto joined_r0x0013042f;
            }
            pIVar12 = (IPalObject *)((ulong)((uint)in_stack_fffffffffffffe0e * 8) * 5);
            pCVar16 = (CFileProcessLocalData *)
                      ((long)&pIVar12->_vptr_IPalObject + (long)(pCVar17->unix_filename + lVar2));
            pFileObject = pIVar12;
            if ((pCVar16 < pCVar15) ||
               (local_70 = (CFileProcessLocalData *)
                           (pCVar6->unix_filename + (long)(local_60->unix_filename + -0x30)),
               local_70 < pCVar16)) goto LAB_00130425;
            local_48 = 8;
            pCVar16 = pCVar6;
            if (in_stack_fffffffffffffe0e == 0) {
              pIVar13 = (IMAGE_DOS_HEADER *)0x1000;
              iVar3 = local_48;
            }
            else {
              pcVar9 = pCVar17->unix_filename +
                       (long)*(int *)(pCVar17->unix_filename + 0x24) +
                       (ulong)(ushort)ntHeader.FileHeader.PointerToSymbolTable + 8;
              pIVar13 = (IMAGE_DOS_HEADER *)0x1000;
              pIVar11 = (IPalObject *)0x0;
              local_68 = pcVar9;
              do {
                pCVar17 = (CFileProcessLocalData *)
                          (pCVar6->unix_filename +
                          ((ulong)*(uint *)((long)&pIVar11->_vptr_IPalObject + (long)(pcVar9 + 4)) -
                          0x18));
                if (pCVar17 < pCVar6) {
LAB_0013048b:
                  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
                  DVar5 = 0x57;
                  iVar3 = 3;
                }
                else {
                  uVar1 = *(uint *)((long)&pIVar11[1]._vptr_IPalObject + (long)pcVar9);
                  if ((((CFileProcessLocalData *)(pCVar17->unix_filename + ((ulong)uVar1 - 0x18)) <
                        pCVar17) ||
                      (local_70 <
                       (CFileProcessLocalData *)(pCVar17->unix_filename + ((ulong)uVar1 - 0x18))))
                     || (addr = (CFileProcessLocalData *)
                                ((long)pIVar13->e_res + (long)(pCVar16->unix_filename + -0x34)),
                        pCVar17 < addr)) goto LAB_0013048b;
                  loadedHeader = pIVar13;
                  local_80 = pCVar16;
                  local_60 = pCVar17;
                  if (uVar1 < *(uint *)((long)&pIVar11->_vptr_IPalObject + (long)pcVar9)) {
                    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
                    DVar5 = 0x57;
                    pIVar12 = pFileObject;
                    pcVar9 = local_68;
                    iVar3 = 3;
                  }
                  else {
                    if (addr < pCVar17) {
                      local_74 = 0;
                      DVar5 = MAPRecordMapping(local_58,pCVar6,addr,(long)pCVar17 - (long)addr,0);
                      if ((DVar5 != 0) && (local_74 = 3, PAL_InitializeChakraCoreCalled == false))
                      goto LAB_001306a0;
                      pIVar12 = pFileObject;
                      pIVar13 = loadedHeader;
                      pCVar16 = local_80;
                      pcVar9 = local_68;
                      iVar3 = local_74;
                      if (DVar5 != 0) goto LAB_001304a0;
                    }
                    uVar1 = *(uint *)((long)&pIVar11[3]._vptr_IPalObject + (long)(local_68 + 4));
                    uVar14 = uVar1 >> 0x1e;
                    DVar5 = MAPmmapAndRecord(local_58,pCVar6,local_60,
                                             (ulong)*(uint *)((long)&pIVar11[1]._vptr_IPalObject +
                                                             (long)local_68),
                                             uVar14 & 0xfffffffe | uVar14 & 1 | uVar1 >> 0x1b & 4,
                                             local_78,*(int *)((long)&pIVar11[1]._vptr_IPalObject +
                                                              (long)(local_68 + 4)),
                                             (off_t)(dosHeader.e_res2 + 8),
                                             (LPVOID *)
                                             CONCAT26(in_stack_fffffffffffffe0e,
                                                      CONCAT24(in_stack_fffffffffffffe0c,
                                                               in_stack_fffffffffffffe08)));
                    if (DVar5 == 0) {
                      sectionName[0] = '\0';
                      memcpy(local_41,(char *)((long)&pIVar11[-3]._vptr_IPalObject +
                                              (long)pCVar15->unix_filename),8);
                      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
                      pIVar12 = pFileObject;
                      pIVar13 = (IMAGE_DOS_HEADER *)
                                (ulong)(*(int *)((long)&pIVar11[1]._vptr_IPalObject + (long)local_68
                                                ) + 0xfffU & 0xfffff000);
                      pCVar16 = local_60;
                      pcVar9 = local_68;
                      iVar3 = 0;
                    }
                    else {
                      pIVar12 = pFileObject;
                      pIVar13 = loadedHeader;
                      pCVar16 = local_80;
                      pcVar9 = local_68;
                      iVar3 = 3;
                      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
                    }
                  }
                }
LAB_001304a0:
              } while ((iVar3 == 0) && (pIVar11 = pIVar11 + 5, iVar3 = local_48, pIVar12 != pIVar11)
                      );
            }
            local_48 = iVar3;
            if (local_48 != 3) {
              if (local_48 != 8) goto LAB_0013008d;
              pCVar17 = (CFileProcessLocalData *)
                        ((long)pIVar13->e_res + (long)(pCVar16->unix_filename + -0x34));
              if (pCVar17 < local_70) {
                iVar3 = 0;
                DVar5 = MAPRecordMapping(local_58,pCVar6,pCVar17,(long)local_70 - (long)pCVar17,0);
                if ((DVar5 != 0) && (iVar3 = 3, PAL_InitializeChakraCoreCalled == false))
                goto LAB_001306a0;
                if (iVar3 == 3) goto LAB_00130435;
                if (iVar3 != 0) goto LAB_0013008d;
              }
              DVar5 = 0;
            }
          }
          else {
joined_r0x0013042f:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
          }
LAB_00130435:
          CorUnix::InternalLeaveCriticalSection(pThread,&mapping_critsec);
          goto LAB_0013003b;
        }
      }
      goto joined_r0x001301ef;
    }
    pCVar6 = (CFileProcessLocalData *)0x0;
    DVar5 = FILEGetLastErrorFromErrno();
  }
LAB_0013003b:
  if (local_a0 != (undefined8 *)0x0) {
    (**(code **)*local_a0)(local_a0,pThread,0);
  }
  if (local_58 != (IPalObject *)0x0) {
    (*local_58->_vptr_IPalObject[8])(local_58,pThread);
  }
  if (DVar5 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001306a0;
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001306a0:
      abort();
    }
    if (pCVar6 != (CFileProcessLocalData *)0x0) {
      MAPUnmapPEFile(pCVar6);
    }
    pCVar6 = (CFileProcessLocalData *)0x0;
  }
LAB_0013008d:
  if (*(long *)(in_FS_OFFSET + 0x28) != sectionName._1_8_) {
    __stack_chk_fail();
  }
  return pCVar6;
}

Assistant:

void * MAPMapPEFile(HANDLE hFile)
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    IDataLock *pLocalDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    CPalThread *pThread = InternalGetCurrentThread();
    void * loadedBase = NULL;
    IMAGE_DOS_HEADER * loadedHeader = NULL;
    void * retval;
#if _DEBUG
    bool forceRelocs = false;
#endif

    ENTRY("MAPMapPEFile (hFile=%p)\n", hFile);

    //Step 0: Verify values, find internal pal data structures.
    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR_(LOADER)( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hFile,
            &aotFile,
            GENERIC_READ,
            &pFileObject
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "ReferenceObjectByHandle failed\n" );
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
            pThread,
            ReadLock,
            &pLocalDataLock,
            reinterpret_cast<void**>(&pLocalData)
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "GetProcessLocalData failed\n" );
        goto done;
    }

    int fd;
    fd = pLocalData->unix_fd;
    //Step 1: Read the PE headers and reserve enough space for the whole image somewhere.
    IMAGE_DOS_HEADER dosHeader;
    IMAGE_NT_HEADERS ntHeader;
    errno = 0;
    if (0 != lseek(fd, 0, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "lseek failed\n" );
        goto done;
    }
    if (sizeof(dosHeader) != read(fd, &dosHeader, sizeof(dosHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "reading dos header failed\n" );
        goto done;
    }
    if (dosHeader.e_lfanew != lseek(fd, dosHeader.e_lfanew, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }
    if (sizeof(ntHeader) != read(fd, &ntHeader, sizeof(ntHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }

    if ((VAL16(IMAGE_DOS_SIGNATURE) != VAL16(dosHeader.e_magic))
        || (VAL32(IMAGE_NT_SIGNATURE) != VAL32(ntHeader.Signature))
        || (VAL16(IMAGE_NT_OPTIONAL_HDR_MAGIC) != VAL16(ntHeader.OptionalHeader.Magic) ) )
    {
        ERROR_(LOADER)( "Magic number mismatch\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //this code requires that the file alignment be the same as the page alignment
    if (ntHeader.OptionalHeader.FileAlignment < VIRTUAL_PAGE_SIZE)
    {
        ERROR_(LOADER)( "Optional header file alignment is bad\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //This doesn't read the entire NT header (the optional header technically has a variable length.  But I
    //don't need more directories.

    //I now know how big the file is.  Reserve enough address space for the whole thing.  Try to get the
    //preferred base.  Create the intial mapping as "no access".  We'll use that for the guard pages in the
    //"holes" between sections.
    SIZE_T preferredBase, virtualSize;
    preferredBase = ntHeader.OptionalHeader.ImageBase;
    virtualSize = ntHeader.OptionalHeader.SizeOfImage;

    // Validate the image header
    if (   (preferredBase == 0)
        || (virtualSize == 0)
        || (preferredBase + virtualSize < preferredBase)    // Does the image overflow?
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

#if _DEBUG
    char * envVar;
    envVar = getenv("PAL_ForceRelocs");
    if (envVar && strlen(envVar) > 0)
    {
        forceRelocs = true;
        TRACE_(LOADER)("Forcing rebase of image\n");
    }
    void * pForceRelocBase;
    pForceRelocBase = NULL;
    if (forceRelocs)
    {
        //if we're forcing relocs, create an anonymous mapping at the preferred base.  Only create the
        //mapping if we can create it at the specified address.
        pForceRelocBase = mmap( (void*)preferredBase, VIRTUAL_PAGE_SIZE, PROT_NONE, MAP_ANON|MAP_FIXED, -1, 0 );
        if (pForceRelocBase == MAP_FAILED)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed\n", (void*)preferredBase);
            forceRelocs = false;
        }
        else if ((void*)preferredBase != pForceRelocBase)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed; actually got %p\n", (void*)preferredBase, pForceRelocBase);
        }
    }
#endif // _DEBUG

    // The first mmap mapping covers the entire file but just reserves space. Subsequent mappings cover
    // individual parts of the file, and actually map pages in. Note that according to the mmap() man page, "A
    // successful mmap deletes any previous mapping in the allocated address range." Also, "If a MAP_FIXED
    // request is successful, the mapping established by mmap() replaces any previous mappings for the process' pages
    // in the range from addr to addr + len." Thus, we will record a series of mappings here, one for the header
    // and each of the sections, as well as all the space between them that we give PROT_NONE protections.

    // We're going to start adding mappings to the mapping list, so take the critical section
    InternalEnterCriticalSection(pThread, &mapping_critsec);

#if !defined(_AMD64_)
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON, -1, 0);
#else // defined(_AMD64_)    
    // MAC64 requires we pass MAP_SHARED (or MAP_PRIVATE) flags - otherwise, the call is failed. 
    // Refer to mmap documentation at http://www.manpagez.com/man/2/mmap/ for details.
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON|MAP_PRIVATE, -1, 0);
#endif // !defined(_AMD64_)

    if (MAP_FAILED == loadedBase)
    {
        ERROR_(LOADER)( "mmap failed with code %d: %s.\n", errno, strerror( errno ) );
        palError = FILEGetLastErrorFromErrno();
        loadedBase = NULL; // clear it so we don't try to use it during clean-up
        goto doneReleaseMappingCriticalSection;
    }

    // All subsequent mappings of the PE file will be in the range [loadedBase, loadedBase + virtualSize)

#if _DEBUG
    if (forceRelocs)
    {
        _ASSERTE(((SIZE_T)loadedBase) != preferredBase);
        munmap(pForceRelocBase, VIRTUAL_PAGE_SIZE); // now that we've forced relocation, let the original address mapping go
    }
    if (((SIZE_T)loadedBase) != preferredBase)
    {
        TRACE_(LOADER)("Image rebased from preferredBase of %p to loadedBase of %p\n", preferredBase, loadedBase);
    }
    else
    {
        TRACE_(LOADER)("Image loaded at preferred base %p\n", loadedBase);
    }
#endif // _DEBUG

    //we have now reserved memory (potentially we got rebased).  Walk the PE sections and map each part
    //separately.

    size_t headerSize;
    headerSize = VIRTUAL_PAGE_SIZE; // if there are lots of sections, this could be wrong

    //first, map the PE header to the first page in the image.  Get pointers to the section headers
    palError = MAPmmapAndRecord(pFileObject, loadedBase,
                    loadedBase, headerSize, PROT_READ, MAP_FILE|MAP_PRIVATE|MAP_FIXED, fd, 0,
                    (void**)&loadedHeader);
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "mmap of PE header failed\n" );
        goto doneReleaseMappingCriticalSection;
    }

    TRACE_(LOADER)("PE header loaded @ %p\n", loadedHeader);
    _ASSERTE(loadedHeader == loadedBase); // we already preallocated the space, and we used MAP_FIXED, so we should have gotten this address
    IMAGE_SECTION_HEADER * firstSection;
    firstSection = (IMAGE_SECTION_HEADER*)(((char *)loadedHeader)
                                           + loadedHeader->e_lfanew
                                           + offsetof(IMAGE_NT_HEADERS, OptionalHeader)
                                           + VAL16(ntHeader.FileHeader.SizeOfOptionalHeader));
    unsigned numSections;
    numSections = ntHeader.FileHeader.NumberOfSections;

    // Validation
    char* sectionHeaderEnd;
    sectionHeaderEnd = (char*)firstSection + numSections * sizeof(IMAGE_SECTION_HEADER);
    if (   ((void*)firstSection < loadedBase)
        || ((char*)firstSection > sectionHeaderEnd)
        || (sectionHeaderEnd > (char*)loadedBase + virtualSize)
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto doneReleaseMappingCriticalSection;
    }

    void* prevSectionBase;
    prevSectionBase = loadedBase; // the first "section" for our purposes is the header
    size_t prevSectionSizeInMemory;
    prevSectionSizeInMemory = headerSize;
    for (unsigned i = 0; i < numSections; ++i)
    {
        //for each section, map the section of the file to the correct virtual offset.  Gather the
        //protection bits from the PE file and convert them to the correct mmap PROT_* flags.
        void * sectionData;
        int prot = 0;
        IMAGE_SECTION_HEADER &currentHeader = firstSection[i];

        void* sectionBase = (char*)loadedBase + currentHeader.VirtualAddress;

        // Validate the section header
        if (   (sectionBase < loadedBase)                                                           // Did computing the section base overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData < (char*)sectionBase)              // Does the section overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData > (char*)loadedBase + virtualSize) // Does the section extend past the end of the image as the header stated?
            || ((char*)prevSectionBase + prevSectionSizeInMemory > sectionBase)                     // Does this section overlap the previous one?
            )
        {
            ERROR_(LOADER)( "section %d is corrupt\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }
        if (currentHeader.Misc.VirtualSize > currentHeader.SizeOfRawData)
        {
            ERROR_(LOADER)( "no support for zero-padded sections, section %d\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }

        // Is there space between the previous section and this one? If so, add a PROT_NONE mapping to cover it.
        if ((char*)prevSectionBase + prevSectionSizeInMemory < sectionBase)
        {
            char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
            palError = MAPRecordMapping(pFileObject,
                            loadedBase,
                            (void*)gapBase,
                            (char*)sectionBase - gapBase,
                            PROT_NONE);
            if (NO_ERROR != palError)
            {
                ERROR_(LOADER)( "recording gap section before section %d failed\n", i );
                goto doneReleaseMappingCriticalSection;
            }
        }

        //Don't discard these sections.  We need them to verify PE files
        //if (currentHeader.Characteristics & IMAGE_SCN_MEM_DISCARDABLE)
        //    continue;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_EXECUTE)
            prot |= PROT_EXEC;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_READ)
            prot |= PROT_READ;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_WRITE)
            prot |= PROT_WRITE;

        palError = MAPmmapAndRecord(pFileObject, loadedBase,
                        sectionBase,
                        currentHeader.SizeOfRawData,
                        prot,
                        MAP_FILE|MAP_PRIVATE|MAP_FIXED,
                        fd,
                        currentHeader.PointerToRawData,
                        &sectionData);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "mmap of section %d failed\n", i );
            goto doneReleaseMappingCriticalSection;
        }

#if _DEBUG
        {
            // Ensure null termination of section name (which is allowed to not be null terminated if exactly 8 characters long)
            char sectionName[9];
            sectionName[8] = '\0';
            memcpy(sectionName, currentHeader.Name, sizeof(currentHeader.Name));
            TRACE_(LOADER)("Section %d '%s' (header @ %p) loaded @ %p (RVA: 0x%x, SizeOfRawData: 0x%x, PointerToRawData: 0x%x)\n",
                i, sectionName, &currentHeader, sectionData, currentHeader.VirtualAddress, currentHeader.SizeOfRawData, currentHeader.PointerToRawData);
        }
#endif // _DEBUG

        prevSectionBase = sectionBase;
        prevSectionSizeInMemory = (currentHeader.SizeOfRawData + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK; // round up to page boundary
    }

    // Is there space after the last section and before the end of the mapped image? If so, add a PROT_NONE mapping to cover it.
    char* imageEnd;
    imageEnd = (char*)loadedBase + virtualSize; // actually, points just after the mapped end
    if ((char*)prevSectionBase + prevSectionSizeInMemory < imageEnd)
    {
        char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
        palError = MAPRecordMapping(pFileObject,
                        loadedBase,
                        (void*)gapBase,
                        imageEnd - gapBase,
                        PROT_NONE);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "recording end of image gap section failed\n" );
            goto doneReleaseMappingCriticalSection;
        }
    }

    palError = ERROR_SUCCESS;

doneReleaseMappingCriticalSection:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

done:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (palError == ERROR_SUCCESS)
    {
        retval = loadedBase;
        LOGEXIT("MAPMapPEFile returns %p\n", retval);
    }
    else
    {
        retval = NULL;
        LOGEXIT("MAPMapPEFile error: %d\n", palError);

        // If we had an error, and had mapped anything, we need to unmap it
        if (loadedBase != NULL)
        {
            MAPUnmapPEFile(loadedBase);
        }
    }
    return retval;
}